

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O2

void __thiscall
libtorrent::aux::torrent::on_resume_data_checked(torrent *this,status_t status,storage_error *error)

{
  undefined1 *puVar1;
  unique_ptr<libtorrent::add_torrent_params,_std::default_delete<libtorrent::add_torrent_params>_>
  *this_00;
  uchar uVar2;
  uint uVar3;
  int iVar4;
  pointer pbVar5;
  peer_list *ppVar6;
  error_category *peVar7;
  unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_> uVar8;
  _Head_base<0UL,_libtorrent::aux::piece_picker_*,_false> this_01;
  _Base_ptr p_Var9;
  uint3 uVar10;
  bool bVar11;
  int iVar12;
  _Rb_tree_color _Var13;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  torrent_peer *tp;
  size_type sVar14;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  char *pcVar15;
  _Base_ptr p_Var16;
  add_torrent_params *paVar17;
  pointer pbVar18;
  piece_index_t pVar19;
  int iVar20;
  ulong uVar21;
  byte bVar22;
  piece_block block;
  _Rb_tree_color _Var23;
  basic_endpoint<boost::asio::ip::tcp> *p;
  endpoint *peVar24;
  basic_endpoint<boost::asio::ip::tcp> *p_1;
  bool bVar25;
  string_view job_name;
  string str;
  undefined1 local_70 [36];
  in_addr_t local_4c;
  int64_t local_48;
  _Head_base<0UL,_libtorrent::aux::peer_list_*,_false> _Stack_40;
  pointer local_38;
  
  if (((this->super_torrent_hot_members).field_0x4b & 4) != 0) {
    return;
  }
  uVar2 = (this->m_need_save_resume_data).m_val;
  if (((status.m_val & 8) != 0) &&
     (iVar12 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                 _vptr_session_logger[5])(),
     (*(uint *)(CONCAT44(extraout_var,iVar12) + 0x68) & 8) != 0)) {
    iVar12 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
               _vptr_session_logger[5])();
    get_handle((torrent *)&str);
    alert_manager::emplace_alert<libtorrent::oversized_file_alert,libtorrent::torrent_handle>
              ((alert_manager *)CONCAT44(extraout_var_00,iVar12),(torrent_handle *)&str);
    ::std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
              ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)&str._M_string_length);
  }
  if ((status.m_val & 1) != 0) {
    job_name._M_str = "check_resume_data";
    job_name._M_len = 0x11;
    handle_disk_error(this,job_name,error,(peer_connection *)0x0,none);
    auto_managed(this,false);
    pause(this);
  }
  state_updated(this);
  this_00 = &this->m_add_torrent_params;
  paVar17 = (this->m_add_torrent_params)._M_t.
            super___uniq_ptr_impl<libtorrent::add_torrent_params,_std::default_delete<libtorrent::add_torrent_params>_>
            ._M_t.
            super__Tuple_impl<0UL,_libtorrent::add_torrent_params_*,_std::default_delete<libtorrent::add_torrent_params>_>
            .super__Head_base<0UL,_libtorrent::add_torrent_params_*,_false>._M_head_impl;
  if (paVar17 != (add_torrent_params *)0x0) {
    pbVar18 = (paVar17->peers).
              super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    for (peVar24 = *(endpoint **)
                    &(paVar17->peers).
                     super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
                     ._M_impl; peVar24 != pbVar18; peVar24 = peVar24 + 1) {
      add_peer(this,peVar24,(peer_source_flags_t)0x10,(pex_flags_t)0x0);
    }
    iVar12 = (*(this->super_request_callback)._vptr_request_callback[6])(this);
    paVar17 = (this_00->_M_t).
              super___uniq_ptr_impl<libtorrent::add_torrent_params,_std::default_delete<libtorrent::add_torrent_params>_>
              ._M_t.
              super__Tuple_impl<0UL,_libtorrent::add_torrent_params_*,_std::default_delete<libtorrent::add_torrent_params>_>
              .super__Head_base<0UL,_libtorrent::add_torrent_params_*,_false>._M_head_impl;
    if ((char)iVar12 != '\0') {
      pbVar18 = *(pointer *)
                 &(paVar17->peers).
                  super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
                  ._M_impl;
      pbVar5 = (paVar17->peers).
               super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (pbVar18 != pbVar5) {
        str._M_dataplus._M_p = (pointer)&str.field_2;
        str._M_string_length = 0;
        str.field_2._M_local_buf[0] = '\0';
        for (; pbVar18 != pbVar5; pbVar18 = pbVar18 + 1) {
          bVar25 = *(short *)&(pbVar18->impl_).data_ != 2;
          if (bVar25) {
            local_48 = *(int64_t *)((long)&(pbVar18->impl_).data_ + 8);
            _Stack_40._M_head_impl =
                 ((_Head_base<0UL,_libtorrent::aux::peer_list_*,_false> *)
                 ((long)&(pbVar18->impl_).data_ + 0x10))->_M_head_impl;
            local_38 = (pointer)(ulong)(pbVar18->impl_).data_.v6.sin6_scope_id;
            local_4c = 0;
          }
          else {
            local_4c = (pbVar18->impl_).data_.v4.sin_addr.s_addr;
            local_48 = 0;
            _Stack_40._M_head_impl = (peer_list *)0x0;
            local_38 = (pointer)0x0;
          }
          local_70._32_4_ = ZEXT14(bVar25);
          boost::asio::ip::address::to_string_abi_cxx11_
                    ((string *)local_70,(address *)(local_70 + 0x20));
          ::std::__cxx11::string::append((string *)&str);
          ::std::__cxx11::string::~string((string *)local_70);
          ::std::__cxx11::string::push_back((char)&str);
        }
        ppVar6 = (this->super_torrent_hot_members).m_peer_list._M_t.
                 super___uniq_ptr_impl<libtorrent::aux::peer_list,_std::default_delete<libtorrent::aux::peer_list>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_libtorrent::aux::peer_list_*,_std::default_delete<libtorrent::aux::peer_list>_>
                 .super__Head_base<0UL,_libtorrent::aux::peer_list_*,_false>._M_head_impl;
        if (ppVar6 == (peer_list *)0x0) {
          uVar21 = 0xffffffffffffffff;
        }
        else {
          uVar21 = (ulong)(uint)ppVar6->m_num_connect_candidates;
        }
        (*(this->super_request_callback)._vptr_request_callback[7])
                  (this,"resume-checked add_peer() [ %s] connect-candidates: %d",
                   str._M_dataplus._M_p,uVar21);
        ::std::__cxx11::string::~string((string *)&str);
        paVar17 = (this->m_add_torrent_params)._M_t.
                  super___uniq_ptr_impl<libtorrent::add_torrent_params,_std::default_delete<libtorrent::add_torrent_params>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_libtorrent::add_torrent_params_*,_std::default_delete<libtorrent::add_torrent_params>_>
                  .super__Head_base<0UL,_libtorrent::add_torrent_params_*,_false>._M_head_impl;
      }
    }
    pbVar18 = (paVar17->banned_peers).
              super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    for (peVar24 = (paVar17->banned_peers).
                   super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; peVar24 != pbVar18;
        peVar24 = peVar24 + 1) {
      tp = add_peer(this,peVar24,(peer_source_flags_t)0x10,(pex_flags_t)0x0);
      if (tp != (torrent_peer *)0x0) {
        ban_peer(this,tp);
      }
    }
    paVar17 = (this_00->_M_t).
              super___uniq_ptr_impl<libtorrent::add_torrent_params,_std::default_delete<libtorrent::add_torrent_params>_>
              ._M_t.
              super__Tuple_impl<0UL,_libtorrent::add_torrent_params_*,_std::default_delete<libtorrent::add_torrent_params>_>
              .super__Head_base<0UL,_libtorrent::add_torrent_params_*,_false>._M_head_impl;
    if ((*(pointer *)
          &(paVar17->peers).
           super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
           ._M_impl !=
         (paVar17->peers).
         super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
         ._M_impl.super__Vector_impl_data._M_finish) ||
       (*(pointer *)
         &(paVar17->banned_peers).
          super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
          ._M_impl !=
        (paVar17->banned_peers).
        super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
        ._M_impl.super__Vector_impl_data._M_finish)) {
      update_want_peers(this);
    }
    ppVar6 = (this->super_torrent_hot_members).m_peer_list._M_t.
             super___uniq_ptr_impl<libtorrent::aux::peer_list,_std::default_delete<libtorrent::aux::peer_list>_>
             ._M_t.
             super__Tuple_impl<0UL,_libtorrent::aux::peer_list_*,_std::default_delete<libtorrent::aux::peer_list>_>
             .super__Head_base<0UL,_libtorrent::aux::peer_list_*,_false>._M_head_impl;
    if ((ppVar6 != (peer_list *)0x0) &&
       (sVar14 = ::std::
                 deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                 ::size((deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                         *)ppVar6), 0 < (int)sVar14)) {
      sVar14 = ::std::
               deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
               ::size((deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                       *)(this->super_torrent_hot_members).m_peer_list._M_t.
                         super___uniq_ptr_impl<libtorrent::aux::peer_list,_std::default_delete<libtorrent::aux::peer_list>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_libtorrent::aux::peer_list_*,_std::default_delete<libtorrent::aux::peer_list>_>
                         .super__Head_base<0UL,_libtorrent::aux::peer_list_*,_false>._M_head_impl);
      (*(this->super_request_callback)._vptr_request_callback[7])
                (this,"resume added peers (total peers: %d)",sVar14 & 0xffffffff);
    }
  }
  bVar22 = 1;
  if ((((status.m_val & 3) == 0) && (bVar22 = status.m_val >> 2 & 1, (status.m_val >> 2 & 1) == 0))
     && ((error->ec).val_ == 0)) {
    bVar22 = 0;
  }
  else {
    paVar17 = (this_00->_M_t).
              super___uniq_ptr_impl<libtorrent::add_torrent_params,_std::default_delete<libtorrent::add_torrent_params>_>
              ._M_t.
              super__Tuple_impl<0UL,_libtorrent::add_torrent_params_*,_std::default_delete<libtorrent::add_torrent_params>_>
              .super__Head_base<0UL,_libtorrent::add_torrent_params_*,_false>._M_head_impl;
    if (((paVar17 != (add_torrent_params *)0x0) && (bVar25 = contains_resume_data(paVar17), bVar25))
       && (iVar12 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                      _vptr_session_logger[5])(),
          (*(uint *)(CONCAT44(extraout_var_01,iVar12) + 0x68) & 0x41) != 0)) {
      iVar12 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                 _vptr_session_logger[5])();
      get_handle((torrent *)local_70);
      resolve_filename_abi_cxx11_(&str,this,(file_index_t)(int)*(int3 *)&error->field_0x10);
      alert_manager::
      emplace_alert<libtorrent::fastresume_rejected_alert,libtorrent::torrent_handle,boost::system::error_code_const&,std::__cxx11::string,libtorrent::operation_t_const&>
                ((alert_manager *)CONCAT44(extraout_var_02,iVar12),(torrent_handle *)local_70,
                 &error->ec,&str,&error->operation);
      ::std::__cxx11::string::~string((string *)&str);
      ::std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
                ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)(local_70 + 8));
    }
  }
  iVar12 = (*(this->super_request_callback)._vptr_request_callback[6])();
  if ((char)iVar12 == '\0') {
LAB_002d4565:
    if (bVar22 == 0) goto LAB_002d45a9;
    this->field_0x5cc = this->field_0x5cc & 0xfb;
    puVar1 = &(this->super_torrent_hot_members).field_0x4b;
    *puVar1 = *puVar1 & 0xbf;
    update_gauge(this);
    update_state_list(this);
  }
  else {
    uVar3 = (error->ec).val_;
    if ((uVar3 != 0 | bVar22) == 1) {
      pcVar15 = operation_name(error->operation);
      uVar10 = *(uint3 *)&error->field_0x10;
      peVar7 = (error->ec).cat_;
      (*peVar7->_vptr_error_category[4])(&str,peVar7,(ulong)(uint)(error->ec).val_);
      (*(this->super_request_callback)._vptr_request_callback[7])
                (this,"fastresume data rejected: ret: %d (%d) op: %s file: %d %s",status.m_val,
                 (ulong)uVar3,pcVar15,(ulong)(uint)((int)((uint)uVar10 << 8) >> 8),
                 str._M_dataplus._M_p);
      ::std::__cxx11::string::~string((string *)&str);
      goto LAB_002d4565;
    }
    (*(this->super_request_callback)._vptr_request_callback[7])(this);
LAB_002d45a9:
    paVar17 = (this_00->_M_t).
              super___uniq_ptr_impl<libtorrent::add_torrent_params,_std::default_delete<libtorrent::add_torrent_params>_>
              ._M_t.
              super__Tuple_impl<0UL,_libtorrent::add_torrent_params_*,_std::default_delete<libtorrent::add_torrent_params>_>
              .super__Head_base<0UL,_libtorrent::add_torrent_params_*,_false>._M_head_impl;
    if (((paVar17 == (add_torrent_params *)0x0) ||
        (uVar8._M_t.super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t.
         super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
         super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl =
              *(__uniq_ptr_data<unsigned_int,_std::default_delete<unsigned_int[]>,_true,_true> *)
               &(paVar17->have_pieces).super_bitfield.m_buf,
        (unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>)
        uVar8._M_t.super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t.
        super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
        super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl ==
        (unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>)0x0)) ||
       ((iVar12 = *(int *)uVar8._M_t.
                          super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>.
                          _M_t.
                          super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>
                          .super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl, iVar12 == 0 ||
        ((((this->super_torrent_hot_members).m_torrent_file.
           super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->m_files
         ).m_num_pieces <= iVar12)))) {
      bVar25 = false;
    }
    else {
      (this->m_num_checked_pieces).m_val = iVar12;
      (this->m_checking_piece).m_val = iVar12;
      bVar25 = true;
    }
    if ((this->field_0x5cc & 4) == 0) {
      if ((error->ec).val_ == 0 && paVar17 != (add_torrent_params *)0x0) {
        uVar8._M_t.super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t.
        super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
        super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl =
             *(__uniq_ptr_data<unsigned_int,_std::default_delete<unsigned_int[]>,_true,_true> *)
              &(paVar17->have_pieces).super_bitfield.m_buf;
        pVar19.m_val = 0;
        iVar12 = 0;
        if ((unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>)
            uVar8._M_t.super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>.
            _M_t.super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
            super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl !=
            (unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>)0x0) {
          iVar12 = *(int *)uVar8._M_t.
                           super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>
                           .super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl;
        }
        iVar20 = (((this->super_torrent_hot_members).m_torrent_file.
                   super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                 ->m_files).m_num_pieces;
        if (iVar20 < iVar12) {
          iVar12 = iVar20;
        }
        if (iVar12 < 1) {
          iVar12 = 0;
        }
        for (; iVar12 != pVar19.m_val; pVar19.m_val = pVar19.m_val + 1) {
          bVar11 = bitfield::get_bit(&(((this_00->_M_t).
                                        super___uniq_ptr_impl<libtorrent::add_torrent_params,_std::default_delete<libtorrent::add_torrent_params>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_libtorrent::add_torrent_params_*,_std::default_delete<libtorrent::add_torrent_params>_>
                                        .
                                        super__Head_base<0UL,_libtorrent::add_torrent_params_*,_false>
                                       ._M_head_impl)->have_pieces).super_bitfield,pVar19.m_val);
          if (bVar11) {
            need_picker(this);
            piece_picker::we_have
                      ((this->super_torrent_hot_members).m_picker._M_t.
                       super___uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
                       .super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>._M_head_impl,
                       pVar19);
            inc_stats_counter(this,0x6b,1);
            update_gauge(this);
            we_have(this,pVar19,true);
          }
        }
        _Var13 = file_storage::blocks_per_piece
                           (&((this->super_torrent_hot_members).m_torrent_file.
                              super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr)->m_files);
        paVar17 = (this_00->_M_t).
                  super___uniq_ptr_impl<libtorrent::add_torrent_params,_std::default_delete<libtorrent::add_torrent_params>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_libtorrent::add_torrent_params_*,_std::default_delete<libtorrent::add_torrent_params>_>
                  .super__Head_base<0UL,_libtorrent::add_torrent_params_*,_false>._M_head_impl;
        for (p_Var16 = (paVar17->unfinished_pieces).
                       super_map<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::bitfield,_std::less<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>,_std::allocator<std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::bitfield>_>_>
                       ._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            (_Rb_tree_header *)p_Var16 !=
            &(paVar17->unfinished_pieces).
             super_map<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::bitfield,_std::less<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>,_std::allocator<std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::bitfield>_>_>
             ._M_t._M_impl.super__Rb_tree_header;
            p_Var16 = (_Base_ptr)::std::_Rb_tree_increment(p_Var16)) {
          pVar19.m_val = p_Var16[1]._M_color;
          block.block_index = 0;
          block.piece_index.m_val = pVar19.m_val;
          if ((-1 < pVar19.m_val) &&
             (pVar19.m_val <
              (((this->super_torrent_hot_members).m_torrent_file.
                super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              m_files).m_num_pieces)) {
            if ((this->field_0x5cc & 4) != 0) {
              leave_seed_mode(this,skip_checking);
            }
            this_01._M_head_impl =
                 (this->super_torrent_hot_members).m_picker._M_t.
                 super___uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
                 .super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>._M_head_impl;
            if ((this_01._M_head_impl != (piece_picker *)0x0) &&
               (bVar11 = piece_picker::have_piece(this_01._M_head_impl,pVar19), bVar11)) {
              piece_picker::we_dont_have
                        ((this->super_torrent_hot_members).m_picker._M_t.
                         super___uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
                         .super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>._M_head_impl
                         ,pVar19);
              update_gauge(this);
            }
            need_picker(this);
            p_Var9 = p_Var16[1]._M_parent;
            if (p_Var9 == (_Base_ptr)0x0) {
              _Var23 = _S_red;
            }
            else {
              _Var23 = p_Var9->_M_color;
            }
            if ((int)_Var13 <= (int)_Var23) {
              _Var23 = _Var13;
            }
            if ((int)_Var23 < 1) {
              _Var23 = _S_red;
            }
            for (uVar21 = 0; _Var23 != uVar21; uVar21 = uVar21 + 1) {
              bVar11 = bitfield::get_bit((bitfield *)&p_Var16[1]._M_parent,(int)uVar21);
              if (bVar11) {
                piece_picker::mark_as_finished
                          ((this->super_torrent_hot_members).m_picker._M_t.
                           super___uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
                           .super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>.
                           _M_head_impl,block,(torrent_peer *)0x0);
              }
              block = (piece_block)((long)block + 0x100000000);
            }
            bVar11 = piece_picker::is_piece_finished
                               ((this->super_torrent_hot_members).m_picker._M_t.
                                super___uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
                                .super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>.
                                _M_head_impl,pVar19);
            if (bVar11) {
              verify_piece(this,pVar19);
            }
          }
        }
      }
    }
    else {
      puVar1 = &(this->super_torrent_hot_members).field_0x4b;
      *puVar1 = *puVar1 | 0x40;
      update_gauge(this);
      update_state_list(this);
      if (((error->ec).val_ == 0) &&
         (paVar17 = (this_00->_M_t).
                    super___uniq_ptr_impl<libtorrent::add_torrent_params,_std::default_delete<libtorrent::add_torrent_params>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_libtorrent::add_torrent_params_*,_std::default_delete<libtorrent::add_torrent_params>_>
                    .super__Head_base<0UL,_libtorrent::add_torrent_params_*,_false>._M_head_impl,
         paVar17 != (add_torrent_params *)0x0)) {
        uVar8._M_t.super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t.
        super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
        super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl =
             *(__uniq_ptr_data<unsigned_int,_std::default_delete<unsigned_int[]>,_true,_true> *)
              &(paVar17->verified_pieces).super_bitfield.m_buf;
        iVar20 = 0;
        iVar12 = 0;
        if ((unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>)
            uVar8._M_t.super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>.
            _M_t.super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
            super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl !=
            (unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>)0x0) {
          iVar12 = *(int *)uVar8._M_t.
                           super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>
                           .super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl;
        }
        iVar4 = (((this->super_torrent_hot_members).m_torrent_file.
                  super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                m_files).m_num_pieces;
        if (iVar4 < iVar12) {
          iVar12 = iVar4;
        }
        if (iVar12 < 1) {
          iVar12 = 0;
        }
        for (; iVar12 != iVar20; iVar20 = iVar20 + 1) {
          bVar11 = bitfield::get_bit(&(((this_00->_M_t).
                                        super___uniq_ptr_impl<libtorrent::add_torrent_params,_std::default_delete<libtorrent::add_torrent_params>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_libtorrent::add_torrent_params_*,_std::default_delete<libtorrent::add_torrent_params>_>
                                        .
                                        super__Head_base<0UL,_libtorrent::add_torrent_params_*,_false>
                                       ._M_head_impl)->verified_pieces).super_bitfield,iVar20);
          if (bVar11) {
            bitfield::set_bit(&(this->m_verified).super_bitfield,iVar20);
          }
        }
      }
    }
    if (!bVar25) {
      files_checked(this);
      goto LAB_002d4704;
    }
  }
  stop_announcing(this);
  set_state(this,checking_files);
  bVar25 = should_check_files(this);
  if (bVar25) {
    start_checking(this);
  }
  (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger[0x2c])();
LAB_002d4704:
  maybe_done_flushing(this);
  ::std::
  __uniq_ptr_impl<libtorrent::add_torrent_params,_std::default_delete<libtorrent::add_torrent_params>_>
  ::reset((__uniq_ptr_impl<libtorrent::add_torrent_params,_std::default_delete<libtorrent::add_torrent_params>_>
           *)this_00,(pointer)0x0);
  (this->m_need_save_resume_data).m_val = uVar2;
  return;
}

Assistant:

void torrent::on_resume_data_checked(status_t const status
		, storage_error const& error) try
	{
#if TORRENT_USE_ASSERTS
		TORRENT_ASSERT(m_outstanding_check_files);
		m_outstanding_check_files = false;
#endif

		// when applying some of the resume data to the torrent, we will
		// trigger calls that set m_need_save_resume_data, even though we're
		// just applying the state of the resume data we loaded with. We don't
		// want anything in this function to affect the state of
		// m_need_save_resume_data, so we save it in a local variable and reset
		// it at the end of the function.
		auto const need_save_resume_data = m_need_save_resume_data;

		TORRENT_ASSERT(is_single_thread());

		if (m_abort) return;

		if (status & disk_status::oversized_file)
		{
			if (m_ses.alerts().should_post<oversized_file_alert>())
				m_ses.alerts().emplace_alert<oversized_file_alert>(get_handle());
		}

		if (status & disk_status::fatal_disk_error)
		{
			TORRENT_ASSERT(m_outstanding_check_files == false);
			handle_disk_error("check_resume_data", error);
			auto_managed(false);
			pause();
		}

		state_updated();

		if (m_add_torrent_params)
		{
			// --- PEERS ---

			for (auto const& p : m_add_torrent_params->peers)
			{
				add_peer(p , peer_info::resume_data);
			}

#ifndef TORRENT_DISABLE_LOGGING
			if (should_log() && !m_add_torrent_params->peers.empty())
			{
				std::string str;
				for (auto const& peer : m_add_torrent_params->peers)
				{
					str += peer.address().to_string();
					str += ' ';
				}
				debug_log("resume-checked add_peer() [ %s] connect-candidates: %d"
					, str.c_str(), m_peer_list
					? m_peer_list->num_connect_candidates() : -1);
			}
#endif

			for (auto const& p : m_add_torrent_params->banned_peers)
			{
				torrent_peer* peer = add_peer(p, peer_info::resume_data);
				if (peer) ban_peer(peer);
			}

			if (!m_add_torrent_params->peers.empty()
				|| !m_add_torrent_params->banned_peers.empty())
			{
				update_want_peers();
			}

#ifndef TORRENT_DISABLE_LOGGING
			if (m_peer_list && m_peer_list->num_peers() > 0)
				debug_log("resume added peers (total peers: %d)"
					, m_peer_list->num_peers());
#endif
		}

		bool const has_error_status
			= (status & disk_status::fatal_disk_error)
			|| (status & disk_status::need_full_check)
			|| (status & disk_status::file_exist);

		// only report this error if the user actually provided resume data
		// (i.e. m_add_torrent_params->have_pieces)
		if ((error || has_error_status)
			&& m_add_torrent_params
			&& aux::contains_resume_data(*m_add_torrent_params)
			&& m_ses.alerts().should_post<fastresume_rejected_alert>())
		{
			m_ses.alerts().emplace_alert<fastresume_rejected_alert>(get_handle()
				, error.ec
				, resolve_filename(error.file())
				, error.operation);
		}

#ifndef TORRENT_DISABLE_LOGGING
		if (should_log())
		{
			if (has_error_status || error)
			{
				debug_log("fastresume data rejected: ret: %d (%d) op: %s file: %d %s"
					, int(static_cast<std::uint8_t>(status)), error.ec.value()
					, operation_name(error.operation)
					, static_cast<int>(error.file())
					, error.ec.message().c_str());
			}
			else
			{
				debug_log("fastresume data accepted");
			}
		}
#endif

		bool should_start_full_check = has_error_status;

		// if we got a partial pieces bitfield, it means we were in the middle of
		// checking this torrent. pick it up where we left off
		if (!has_error_status
			&& m_add_torrent_params
			&& !m_add_torrent_params->have_pieces.empty()
			&& m_add_torrent_params->have_pieces.size() < m_torrent_file->num_pieces())
		{
			m_checking_piece = m_num_checked_pieces
				= m_add_torrent_params->have_pieces.end_index();
			should_start_full_check = true;
		}

		// if ret != 0, it means we need a full check. We don't necessarily need
		// that when the resume data check fails. For instance, if the resume data
		// is incorrect, but we don't have any files, we skip the check and initialize
		// the storage to not have anything.
		if (!has_error_status)
		{
			// there are either no files for this torrent
			// or the resume_data was accepted

			if (m_seed_mode)
			{
				m_have_all = true;
				update_gauge();
				update_state_list();

				if (!error && m_add_torrent_params)
				{
					int const num_pieces2 = std::min(m_add_torrent_params->verified_pieces.size()
						, torrent_file().num_pieces());
					for (piece_index_t i{0}; i < piece_index_t(num_pieces2); ++i)
					{
						if (!m_add_torrent_params->verified_pieces[i]) continue;
						m_verified.set_bit(i);
					}
				}
			}
			else if (!error && m_add_torrent_params)
			{
				// --- PIECES ---

				int const num_pieces = std::min(m_add_torrent_params->have_pieces.size()
					, torrent_file().num_pieces());
				for (piece_index_t i{0}; i < piece_index_t(num_pieces); ++i)
				{
					if (!m_add_torrent_params->have_pieces[i]) continue;
					need_picker();
					m_picker->we_have(i);
					inc_stats_counter(counters::num_piece_passed);
					update_gauge();
					we_have(i, true);
				}

				// --- UNFINISHED PIECES ---

				int const num_blocks_per_piece = torrent_file().blocks_per_piece();

				for (auto const& p : m_add_torrent_params->unfinished_pieces)
				{
					piece_index_t const piece = p.first;
					bitfield const& blocks = p.second;

					if (piece < piece_index_t(0) || piece >= torrent_file().end_piece())
					{
						continue;
					}

					// being in seed mode and missing a piece is not compatible.
					// Leave seed mode if that happens
					if (m_seed_mode) leave_seed_mode(seed_mode_t::skip_checking);

					if (has_picker() && m_picker->have_piece(piece))
					{
						m_picker->we_dont_have(piece);
						update_gauge();
					}

					need_picker();

					const int num_bits = std::min(num_blocks_per_piece, int(blocks.size()));
					for (int k = 0; k < num_bits; ++k)
					{
						if (blocks.get_bit(k))
						{
							m_picker->mark_as_finished(piece_block(piece, k), nullptr);
						}
					}
					if (m_picker->is_piece_finished(piece))
					{
						verify_piece(piece);
					}
				}
			}
		}
		else
		{
			m_seed_mode = false;
			// either the fastresume data was rejected or there are
			// some files
			m_have_all = false;
			update_gauge();
			update_state_list();
		}

		if (should_start_full_check)
		{
			stop_announcing();
			set_state(torrent_status::checking_files);
			if (should_check_files()) start_checking();

			// start the checking right away (potentially)
			m_ses.trigger_auto_manage();
		}
		else
		{
			files_checked();
		}

		// this will remove the piece picker, if we're done with it
		maybe_done_flushing();
		TORRENT_ASSERT(m_outstanding_check_files == false);
		m_add_torrent_params.reset();

		// restore m_need_save_resume_data to its state when we entered this
		// function.
		m_need_save_resume_data = need_save_resume_data;
	}
	catch (...) { handle_exception(); }